

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::NamedMaterial(ParsedScene *this,string *name,FileLoc loc)

{
  char *fmt;
  
  if (this->currentApiState == OptionsBlock) {
    fmt = "Scene description must be inside world block; \"%s\" not allowed. Ignoring.";
  }
  else {
    if (this->currentApiState != Uninitialized) {
      std::__cxx11::string::_M_assign((string *)&this->graphicsState->currentMaterialName);
      this->graphicsState->currentMaterialIndex = -1;
      return;
    }
    fmt = "pbrtInit() must be before calling \"%s()\". Ignoring.";
  }
  Error<char_const(&)[14]>(&loc,fmt,(char (*) [14])0x430e8e);
  return;
}

Assistant:

void ParsedScene::NamedMaterial(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("NamedMaterial");
    graphicsState->currentMaterialName = name;
    graphicsState->currentMaterialIndex = -1;
}